

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsInt(CodedInputStream *this,int *value)

{
  int iVar1;
  int v;
  int *value_local;
  CodedInputStream *this_local;
  
  if ((this->buffer_ < this->buffer_end_) && (*this->buffer_ < 0x80)) {
    *value = (uint)*this->buffer_;
    Advance(this,1);
    this_local._7_1_ = true;
  }
  else {
    iVar1 = ReadVarintSizeAsIntFallback(this);
    *value = iVar1;
    this_local._7_1_ = -1 < *value;
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadVarintSizeAsInt(int* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_)) {
    int v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  *value = ReadVarintSizeAsIntFallback();
  return *value >= 0;
}